

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.hpp
# Opt level: O0

void __thiscall
Callback::Emitter::emit<MyEmitter,String,int>
          (Emitter *this,offset_in_MyEmitter_to_subr signal,String *arg0,int arg1)

{
  void *pvVar1;
  bool bVar2;
  Slot *pSVar3;
  undefined4 in_register_0000000c;
  long *plVar4;
  undefined4 in_R8D;
  code *local_100;
  String local_b8;
  Iterator local_90;
  Iterator i;
  MemberFuncPtr local_78;
  undefined1 local_68 [8];
  SignalActivation activation;
  int arg1_local;
  String *arg0_local;
  offset_in_MyEmitter_to_subr signal_local;
  Emitter *this_local;
  
  i.item = (Item *)signal;
  activation.end.item._4_4_ = in_R8D;
  MemberFuncPtr::MemberFuncPtr<void(MyEmitter::*)(String,int)>(&local_78,signal);
  SignalActivation::SignalActivation((SignalActivation *)local_68,this,&local_78);
  local_90.item = (Item *)activation.data;
  while (bVar2 = List<Callback::Emitter::Slot>::Iterator::operator!=(&local_90,&activation.begin),
        bVar2) {
    pSVar3 = List<Callback::Emitter::Slot>::Iterator::operator->(&local_90);
    if (pSVar3->state == connected) {
      pSVar3 = List<Callback::Emitter::Slot>::Iterator::operator->(&local_90);
      pvVar1 = pSVar3->object;
      pSVar3 = List<Callback::Emitter::Slot>::Iterator::operator->(&local_90);
      local_100 = (code *)(pSVar3->slot).ptr;
      plVar4 = (long *)((long)pvVar1 + *(long *)&(pSVar3->slot).field_0x8);
      if (((ulong)local_100 & 1) != 0) {
        local_100 = *(code **)(local_100 + *plVar4 + -1);
      }
      String::String(&local_b8,(String *)CONCAT44(in_register_0000000c,arg1));
      (*local_100)(plVar4,&local_b8,activation.end.item._4_4_);
      String::~String(&local_b8);
    }
    if (((byte)activation.next & 1) != 0) break;
    List<Callback::Emitter::Slot>::Iterator::operator++(&local_90);
  }
  SignalActivation::~SignalActivation((SignalActivation *)local_68);
  return;
}

Assistant:

void emit(void (X::*signal)(A, B), A arg0, B arg1){SignalActivation activation(this, signal); for(List<Slot>::Iterator i = activation.begin; i != activation.end; ++i) {if(i->state == Slot::connected) 
      (((X*)i->object)->*((MemberFuncPtr2<X, A, B>*)&i->slot)->ptr)(arg0, arg1); if(activation.invalidated) return;}}